

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

uint Catch::rngSeed(void)

{
  IConfig *pIVar1;
  uint local_c;
  
  pIVar1 = getGlobalConfig();
  if (pIVar1 == (IConfig *)0x0) {
    local_c = 0;
  }
  else {
    pIVar1 = getGlobalConfig();
    local_c = (*(pIVar1->super_IShared).super_NonCopyable._vptr_NonCopyable[0xf])();
  }
  return local_c;
}

Assistant:

unsigned int rngSeed() {
        return getGlobalConfig()
            ? getGlobalConfig()->rngSeed()
            : 0;
    }